

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::format_va
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,C *formatString,axl_va_list *va
          )

{
  size_t length;
  C *pCVar1;
  axl_va_list local_68;
  axl_va_list local_48;
  
  local_68._0_8_ = *(undefined8 *)va;
  local_68._8_8_ = *(undefined8 *)&va->field_0x8;
  local_68._16_8_ = *(undefined8 *)&va->field_0x10;
  local_68.m_isInitialized = true;
  length = StringDetailsBase<char>::calcFormatLength_va(formatString,&local_68);
  if (local_68.m_isInitialized == true) {
    local_68.m_isInitialized = false;
  }
  pCVar1 = createBuffer(this,length,false);
  if (pCVar1 == (C *)0x0) {
    length = 0xffffffffffffffff;
  }
  else {
    local_48._0_8_ = *(undefined8 *)va;
    local_48._8_8_ = *(undefined8 *)&va->field_0x8;
    local_48._16_8_ = *(undefined8 *)&va->field_0x10;
    local_48.m_isInitialized = true;
    StringDetailsBase<char>::format_va
              ((this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p,length + 1,
               formatString,&local_48);
  }
  return length;
}

Assistant:

size_t
	format_va(
		const C* formatString,
		axl_va_list va
	) {
		size_t length = Details::calcFormatLength_va(formatString, va);
		if (!createBuffer(length, false))
			return -1;

		Details::format_va(this->m_p, length + 1, formatString, va);
		return length;
	}